

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void google::protobuf::CleanStringLineEndings(string *src,string *dst,bool auto_end_last_line)

{
  byte bVar1;
  undefined1 local_40 [8];
  string tmp;
  bool auto_end_last_line_local;
  string *dst_local;
  string *src_local;
  
  tmp.field_2._M_local_buf[0xf] = auto_end_last_line;
  bVar1 = std::__cxx11::string::empty();
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)local_40,(string *)src);
    CleanStringLineEndings((string *)local_40,(bool)(tmp.field_2._M_local_buf[0xf] & 1));
    std::__cxx11::string::append((string *)dst);
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    std::__cxx11::string::append((string *)dst);
    CleanStringLineEndings(dst,(bool)(tmp.field_2._M_local_buf[0xf] & 1));
  }
  return;
}

Assistant:

void CleanStringLineEndings(const std::string &src, std::string *dst,
                            bool auto_end_last_line) {
  if (dst->empty()) {
    dst->append(src);
    CleanStringLineEndings(dst, auto_end_last_line);
  } else {
    std::string tmp = src;
    CleanStringLineEndings(&tmp, auto_end_last_line);
    dst->append(tmp);
  }
}